

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int i2c_block_process_call(uint handle,uint reg,char *buf,uint count)

{
  int sent;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)count;
  ext[0].ptr = buf;
  sent = pigpio_command_ext(gPigCommand,0x46,handle,reg,count,1,ext,0);
  if (0 < sent) {
    sent = recvMax(buf,0x20,sent);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return sent;
}

Assistant:

int i2c_block_process_call(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   bytes = pigpio_command_ext
      (gPigCommand, PI_CMD_I2CPK, handle, reg, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, 32, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}